

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
peach::exception::UndefinedOperatorError::UndefinedOperatorError
          (UndefinedOperatorError *this,size_t line,size_t position)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  size_t local_20;
  size_t position_local;
  size_t line_local;
  UndefinedOperatorError *this_local;
  
  local_20 = position;
  position_local = line;
  line_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"UndefinedOperatorError",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"can\'t find operator",&local_79);
  PositionalError::PositionalError(&this->super_PositionalError,line,position,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&(this->super_PositionalError).super_PeachException =
       &PTR__UndefinedOperatorError_001d9a98;
  return;
}

Assistant:

UndefinedOperatorError(std::size_t line,
                           std::size_t position)
        : PositionalError(line,
                          position,
                          "UndefinedOperatorError", "can't find operator")
    {
    }